

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

int __thiscall
rr::SingleSampleLineRasterizer::init(SingleSampleLineRasterizer *this,EVP_PKEY_CTX *ctx)

{
  deInt32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  deInt64 dVar6;
  long lVar7;
  deInt64 dVar8;
  long lVar9;
  deInt64 dVar10;
  long lVar11;
  deInt64 dVar12;
  long lVar13;
  long lVar14;
  deInt64 dVar15;
  int *piVar16;
  Vector<float,_4> *in_RDX;
  float in_XMM0_Da;
  float fVar17;
  float fVar18;
  double dVar19;
  int local_c4;
  deInt64 yMax;
  deInt64 yMin;
  deInt64 xMax;
  deInt64 xMin;
  deInt64 y1;
  deInt64 x1;
  deInt64 y0;
  deInt64 x0;
  undefined1 local_60 [8];
  Vector<long,_2> widthOffset;
  deInt32 lineWidthPixels;
  Vector<float,_4> local_38;
  byte local_25;
  float local_24;
  bool isXMajor;
  Vector<float,_4> *pVStack_20;
  float lineWidth_local;
  Vec4 *v1_local;
  Vec4 *v0_local;
  SingleSampleLineRasterizer *this_local;
  
  local_24 = in_XMM0_Da;
  pVStack_20 = in_RDX;
  v1_local = (Vec4 *)ctx;
  v0_local = (Vec4 *)this;
  tcu::operator-((tcu *)&local_38,in_RDX,(Vector<float,_4> *)ctx);
  pfVar5 = tcu::Vector<float,_4>::x(&local_38);
  fVar17 = de::abs<float>(*pfVar5);
  tcu::operator-((tcu *)&stack0xffffffffffffffb8,pVStack_20,v1_local);
  pfVar5 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&stack0xffffffffffffffb8);
  fVar18 = de::abs<float>(*pfVar5);
  local_25 = fVar18 <= fVar17;
  if (local_24 <= 1.0) {
    local_c4 = 1;
  }
  else {
    dVar19 = std::floor((double)(ulong)(uint)(local_24 + 0.5));
    local_c4 = (int)SUB84(dVar19,0);
  }
  widthOffset.m_data[1]._4_4_ = local_c4;
  if ((local_25 & 1) == 0) {
    tcu::Vector<long,_2>::Vector((Vector<long,_2> *)&x0,-1,0);
  }
  else {
    tcu::Vector<long,_2>::Vector((Vector<long,_2> *)&x0,0,-1);
  }
  dVar6 = toSubpixelCoord(widthOffset.m_data[1]._4_4_ + -1);
  tcu::operator*((tcu *)local_60,(Vector<long,_2> *)&x0,dVar6 / 2);
  fVar17 = tcu::Vector<float,_4>::x(v1_local);
  dVar6 = toSubpixelCoord(fVar17);
  lVar7 = tcu::Vector<long,_2>::x((Vector<long,_2> *)local_60);
  fVar17 = tcu::Vector<float,_4>::y(v1_local);
  dVar8 = toSubpixelCoord(fVar17);
  lVar9 = tcu::Vector<long,_2>::y((Vector<long,_2> *)local_60);
  fVar17 = tcu::Vector<float,_4>::x(pVStack_20);
  dVar10 = toSubpixelCoord(fVar17);
  lVar11 = tcu::Vector<long,_2>::x((Vector<long,_2> *)local_60);
  fVar17 = tcu::Vector<float,_4>::y(pVStack_20);
  dVar12 = toSubpixelCoord(fVar17);
  lVar13 = tcu::Vector<long,_2>::y((Vector<long,_2> *)local_60);
  lVar14 = de::min<long>(dVar6 + lVar7,dVar10 + lVar11);
  dVar15 = toSubpixelCoord(1);
  lVar7 = de::max<long>(dVar6 + lVar7,dVar10 + lVar11);
  dVar6 = toSubpixelCoord(1);
  lVar11 = de::min<long>(dVar8 + lVar9,dVar12 + lVar13);
  dVar10 = toSubpixelCoord(1);
  lVar9 = de::max<long>(dVar8 + lVar9,dVar12 + lVar13);
  dVar8 = toSubpixelCoord(1);
  if ((local_25 & 1) == 0) {
    dVar1 = floorSubpixelToPixelCoord(lVar11 - dVar10,true);
    iVar2 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar3 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar4 = tcu::Vector<int,_4>::w(&this->m_viewport);
    iVar2 = de::clamp<int>(dVar1,iVar2,iVar3 + iVar4 + -1);
    piVar16 = tcu::Vector<int,_2>::y(&this->m_bboxMin);
    *piVar16 = iVar2;
    dVar1 = ceilSubpixelToPixelCoord(lVar9 + dVar8,true);
    iVar2 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar3 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar4 = tcu::Vector<int,_4>::w(&this->m_viewport);
    iVar2 = de::clamp<int>(dVar1,iVar2,iVar3 + iVar4 + -1);
    piVar16 = tcu::Vector<int,_2>::y(&this->m_bboxMax);
    *piVar16 = iVar2;
    dVar1 = floorSubpixelToPixelCoord(lVar14 - dVar15,true);
    iVar2 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar2 = iVar2 - widthOffset.m_data[1]._4_4_;
    iVar3 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar4 = tcu::Vector<int,_4>::z(&this->m_viewport);
    iVar2 = de::clamp<int>(dVar1,iVar2,iVar3 + iVar4 + -1);
    piVar16 = tcu::Vector<int,_2>::x(&this->m_bboxMin);
    *piVar16 = iVar2;
    dVar1 = ceilSubpixelToPixelCoord(lVar7 + dVar6,true);
    iVar2 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar2 = iVar2 - widthOffset.m_data[1]._4_4_;
    iVar3 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar4 = tcu::Vector<int,_4>::z(&this->m_viewport);
    iVar2 = de::clamp<int>(dVar1,iVar2,iVar3 + iVar4 + -1);
    piVar16 = tcu::Vector<int,_2>::x(&this->m_bboxMax);
    *piVar16 = iVar2;
  }
  else {
    dVar1 = floorSubpixelToPixelCoord(lVar14 - dVar15,true);
    iVar2 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar3 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar4 = tcu::Vector<int,_4>::z(&this->m_viewport);
    iVar2 = de::clamp<int>(dVar1,iVar2,iVar3 + iVar4 + -1);
    piVar16 = tcu::Vector<int,_2>::x(&this->m_bboxMin);
    *piVar16 = iVar2;
    dVar1 = ceilSubpixelToPixelCoord(lVar7 + dVar6,true);
    iVar2 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar3 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar4 = tcu::Vector<int,_4>::z(&this->m_viewport);
    iVar2 = de::clamp<int>(dVar1,iVar2,iVar3 + iVar4 + -1);
    piVar16 = tcu::Vector<int,_2>::x(&this->m_bboxMax);
    *piVar16 = iVar2;
    dVar1 = floorSubpixelToPixelCoord(lVar11 - dVar10,true);
    iVar2 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar2 = iVar2 - widthOffset.m_data[1]._4_4_;
    iVar3 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar4 = tcu::Vector<int,_4>::w(&this->m_viewport);
    iVar2 = de::clamp<int>(dVar1,iVar2,iVar3 + iVar4 + -1);
    piVar16 = tcu::Vector<int,_2>::y(&this->m_bboxMin);
    *piVar16 = iVar2;
    dVar1 = ceilSubpixelToPixelCoord(lVar9 + dVar8,true);
    iVar2 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar2 = iVar2 - widthOffset.m_data[1]._4_4_;
    iVar3 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar4 = tcu::Vector<int,_4>::w(&this->m_viewport);
    iVar2 = de::clamp<int>(dVar1,iVar2,iVar3 + iVar4 + -1);
    piVar16 = tcu::Vector<int,_2>::y(&this->m_bboxMax);
    *piVar16 = iVar2;
  }
  this->m_lineWidth = local_24;
  *(undefined8 *)(this->m_v0).m_data = *(undefined8 *)v1_local->m_data;
  *(undefined8 *)((this->m_v0).m_data + 2) = *(undefined8 *)(v1_local->m_data + 2);
  *(undefined8 *)(this->m_v1).m_data = *(undefined8 *)pVStack_20->m_data;
  *(undefined8 *)((this->m_v1).m_data + 2) = *(undefined8 *)(pVStack_20->m_data + 2);
  *(undefined8 *)(this->m_curPos).m_data = *(undefined8 *)(this->m_bboxMin).m_data;
  this->m_curRowFragment = 0;
  return (int)this;
}

Assistant:

void SingleSampleLineRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, float lineWidth)
{
	const bool						isXMajor		= de::abs((v1 - v0).x()) >= de::abs((v1 - v0).y());

	// Bounding box \note: with wide lines, the line is actually moved as in the spec
	const deInt32					lineWidthPixels	= (lineWidth > 1.0f) ? (deInt32)floor(lineWidth + 0.5f) : 1;

	const tcu::Vector<deInt64,2>	widthOffset		= (isXMajor ? tcu::Vector<deInt64,2>(0, -1) : tcu::Vector<deInt64,2>(-1, 0)) * (toSubpixelCoord(lineWidthPixels - 1) / 2);

	const deInt64					x0				= toSubpixelCoord(v0.x()) + widthOffset.x();
	const deInt64					y0				= toSubpixelCoord(v0.y()) + widthOffset.y();
	const deInt64					x1				= toSubpixelCoord(v1.x()) + widthOffset.x();
	const deInt64					y1				= toSubpixelCoord(v1.y()) + widthOffset.y();

	// line endpoints might be perturbed, add some margin
	const deInt64					xMin			= de::min(x0, x1) - toSubpixelCoord(1);
	const deInt64					xMax			= de::max(x0, x1) + toSubpixelCoord(1);
	const deInt64					yMin			= de::min(y0, y1) - toSubpixelCoord(1);
	const deInt64					yMax			= de::max(y0, y1) + toSubpixelCoord(1);

	// Remove invisible area

	if (isXMajor)
	{
		// clamp to viewport in major direction
		m_bboxMin.x() = de::clamp(floorSubpixelToPixelCoord(xMin, true), m_viewport.x(), m_viewport.x() + m_viewport.z() - 1);
		m_bboxMax.x() = de::clamp(ceilSubpixelToPixelCoord (xMax, true), m_viewport.x(), m_viewport.x() + m_viewport.z() - 1);

		// clamp to padded viewport in minor direction (wide lines might bleed over viewport in minor direction)
		m_bboxMin.y() = de::clamp(floorSubpixelToPixelCoord(yMin, true), m_viewport.y() - lineWidthPixels, m_viewport.y() + m_viewport.w() - 1);
		m_bboxMax.y() = de::clamp(ceilSubpixelToPixelCoord (yMax, true), m_viewport.y() - lineWidthPixels, m_viewport.y() + m_viewport.w() - 1);
	}
	else
	{
		// clamp to viewport in major direction
		m_bboxMin.y() = de::clamp(floorSubpixelToPixelCoord(yMin, true), m_viewport.y(), m_viewport.y() + m_viewport.w() - 1);
		m_bboxMax.y() = de::clamp(ceilSubpixelToPixelCoord (yMax, true), m_viewport.y(), m_viewport.y() + m_viewport.w() - 1);

		// clamp to padded viewport in minor direction (wide lines might bleed over viewport in minor direction)
		m_bboxMin.x() = de::clamp(floorSubpixelToPixelCoord(xMin, true), m_viewport.x() - lineWidthPixels, m_viewport.x() + m_viewport.z() - 1);
		m_bboxMax.x() = de::clamp(ceilSubpixelToPixelCoord (xMax, true), m_viewport.x() - lineWidthPixels, m_viewport.x() + m_viewport.z() - 1);
	}

	m_lineWidth = lineWidth;

	m_v0 = v0;
	m_v1 = v1;

	m_curPos = m_bboxMin;
	m_curRowFragment = 0;
}